

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::compare(bigint *lhs,bigint *rhs)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  buffer<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  bigit rhs_bigit;
  bigit lhs_bigit;
  int end;
  int j;
  int i;
  int num_rhs_bigits;
  int num_lhs_bigits;
  bigit in_stack_ffffffffffffffcc;
  bigit in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  int local_4;
  
  iVar1 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                            );
  iVar2 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                            );
  if (iVar1 == iVar2) {
    sVar3 = buffer<unsigned_int>::size(in_RDI);
    local_24 = (int)sVar3 + -1;
    sVar3 = buffer<unsigned_int>::size(in_RSI);
    local_28 = (int)sVar3 + -1;
    iVar1 = local_24 - local_28;
    if (iVar1 < 0) {
      iVar1 = 0;
    }
    for (; iVar1 <= local_24; local_24 = local_24 + -1) {
      in_stack_ffffffffffffffd0 =
           bigint::operator[]((bigint *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffcc =
           bigint::operator[]((bigint *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
      if (in_stack_ffffffffffffffd0 != in_stack_ffffffffffffffcc) {
        if (in_stack_ffffffffffffffd0 <= in_stack_ffffffffffffffcc) {
          return -1;
        }
        return 1;
      }
      local_28 = local_28 + -1;
    }
    if (local_24 == local_28) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
      if (local_28 < local_24) {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = -1;
    if (iVar2 < iVar1) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR20 int compare(const bigint& lhs, const bigint& rhs) {
    int num_lhs_bigits = lhs.num_bigits(), num_rhs_bigits = rhs.num_bigits();
    if (num_lhs_bigits != num_rhs_bigits)
      return num_lhs_bigits > num_rhs_bigits ? 1 : -1;
    int i = static_cast<int>(lhs.bigits_.size()) - 1;
    int j = static_cast<int>(rhs.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit lhs_bigit = lhs[i], rhs_bigit = rhs[j];
      if (lhs_bigit != rhs_bigit) return lhs_bigit > rhs_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }